

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O1

void container_suite::test_set_one(void)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  value_type input [6];
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> value;
  iarchive in;
  undefined4 local_f4;
  size_t local_f0;
  uchar local_e8 [8];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_e0;
  iarchive local_b0;
  
  local_e8[4] = 0x93;
  local_e8[5] = 0x91;
  local_e8[0] = 0x90;
  local_e8[1] = 0x92;
  local_e8[2] = 0x82;
  local_e8[3] = '\x12';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>(&local_b0,(uchar (*) [6])local_e8)
  ;
  p_Var1 = &local_e0._M_impl.super__Rb_tree_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  boost::serialization::
  singleton<boost::archive::detail::iserializer<trial::protocol::bintoken::iarchive,_container_suite::type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_iarchive::load_object(&local_b0,(basic_iserializer *)&local_e0);
  local_f0 = local_e0._M_impl.super__Rb_tree_header._M_node_count;
  local_f4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x332,"void container_suite::test_set_one()",&local_f0,&local_f4);
  p_Var3 = &p_Var1->_M_header;
  for (p_Var2 = local_e0._M_impl.super__Rb_tree_header._M_header._M_parent;
      (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
      p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 0x12]) {
    if (0x11 < (int)*(size_t *)(p_Var2 + 1)) {
      p_Var3 = p_Var2;
    }
  }
  p_Var4 = p_Var1;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = (_Rb_tree_header *)p_Var3, 0x12 < (int)((_Rb_tree_header *)p_Var3)->_M_node_count)) {
    p_Var4 = p_Var1;
  }
  local_f0 = (size_t)(p_Var4 != p_Var1);
  local_f4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.data.count(0x12)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x333,"void container_suite::test_set_one()",&local_f0,&local_f4);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_e0);
  local_b0.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_b0 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_b0);
  return;
}

Assistant:

void test_set_one()
{
    const value_type input[] = { token::code::begin_record,
                                 token::code::begin_array,
                                 token::code::null,
                                 0x12,
                                 token::code::end_array,
                                 token::code::end_record };
    format::iarchive in(input);
    type_struct< std::set<int> > value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.data.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value.data.count(0x12), 1);
}